

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeDependencies.cpp
# Opt level: O3

pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
__thiscall
helics::TimeDependencies::checkForIssues_abi_cxx11_
          (pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,TimeDependencies *this,bool waiting)

{
  pointer pDVar1;
  byte bVar2;
  pointer pDVar3;
  char *pcVar4;
  char *pcVar5;
  
  pDVar3 = (this->dependencies).
           super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pDVar1 = (this->dependencies).
           super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  do {
    if (pDVar3 == pDVar1) {
      __return_storage_ptr__->first = 0;
      (__return_storage_ptr__->second)._M_dataplus._M_p =
           (pointer)&(__return_storage_ptr__->second).field_2;
      pcVar4 = "";
      pcVar5 = "";
LAB_00303779:
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&__return_storage_ptr__->second,pcVar5,pcVar4);
      return __return_storage_ptr__;
    }
    if ((((pDVar3->dependency == true) && (pDVar3->dependent == true)) &&
        ((pDVar3->super_TimeData).delayedTiming == true)) && (pDVar3->connection != SELF)) {
      (this->mDelayedDependency).gid = (pDVar3->fedID).gid;
      bVar2 = waiting & 1;
      waiting = true;
      if (bVar2 != 0) {
        __return_storage_ptr__->first = 0xf;
        (__return_storage_ptr__->second)._M_dataplus._M_p =
             (pointer)&(__return_storage_ptr__->second).field_2;
        pcVar5 = "Multiple federates declaring wait_for_current_time flag will result in deadlock";
        pcVar4 = "";
        goto LAB_00303779;
      }
    }
    pDVar3 = pDVar3 + 1;
  } while( true );
}

Assistant:

std::pair<int, std::string> TimeDependencies::checkForIssues(bool waiting) const
{
    // check for timing deadlock with wait_for_current_time_flag

    bool hasDelayedTiming = waiting;
    for (const auto& dep : dependencies) {
        if (dep.dependency && dep.dependent && dep.delayedTiming &&
            dep.connection != ConnectionType::SELF) {
            mDelayedDependency = dep.fedID;
            if (hasDelayedTiming) {
                return {
                    multiple_wait_for_current_time_flags,
                    "Multiple federates declaring wait_for_current_time flag will result in deadlock"};
            }
            hasDelayedTiming = true;
        }
    }
    return {0, ""};
}